

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O0

void idx2::EncodeBrick(idx2_file *Idx2,params *P,encode_data *E,bool IncrementLevel)

{
  anon_union_8_4_6ba14846_for_v2<int>_1 *this;
  int iVar1;
  undefined8 uVar2;
  volume_iterator<double> Beg;
  volume_iterator<double> End;
  bucket_status *pbVar3;
  undefined8 uVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  v3<int> *pvVar8;
  u64 uVar9;
  v3i Brick3_00;
  iterator local_c18;
  undefined1 local_bf8 [23];
  bool LastChild;
  uint local_be0;
  undefined8 local_bd4;
  uint local_bcc;
  undefined1 local_bc8 [8];
  extent ToGrid;
  grid SbGridNonExt;
  int local_b90;
  int iStack_b8c;
  v3i LocalBrickPos3;
  undefined8 local_b6c;
  uint local_b64;
  undefined1 local_b60 [16];
  undefined8 local_b50;
  int local_b48;
  extent local_b40;
  extent local_b30;
  extent local_b20;
  undefined8 local_b10;
  v3i NChildren3;
  undefined8 local_ae0;
  int local_ad8;
  undefined8 local_ad4;
  v3i From3;
  undefined1 auStack_ac0 [8];
  volume_iterator<double> Iter_1;
  volume_iterator<double> Iter;
  brick_volume PBrickVol;
  iterator PbIt;
  u64 PKey;
  u64 PBrick;
  v3i PBrick3;
  v3i Brick3;
  i8 NextLevel;
  int iStack_964;
  int iStack_944;
  int local_928;
  int local_908;
  uint local_8fc;
  uint local_8f8;
  v3i SbDimsNonExt3;
  subband *S;
  i8 Sb;
  bool CoarsestLevel;
  anon_union_12_8_3dedac88_for_v3<int>_1 local_8cc;
  volume *local_8c0;
  volume *BVol;
  undefined1 local_8b0 [8];
  iterator BIt;
  u64 Brick;
  i8 Level;
  bool IncrementLevel_local;
  encode_data *E_local;
  params *P_local;
  idx2_file *Idx2_local;
  undefined8 local_7dc;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_7d0;
  undefined4 local_7c4;
  undefined8 *local_7c0;
  undefined8 local_7b8;
  int local_7b0;
  undefined8 local_7a8;
  int local_7a0;
  undefined8 local_798;
  int local_790;
  undefined8 local_788;
  int local_780;
  undefined4 local_77c;
  undefined4 local_778;
  v3i To3;
  undefined8 local_730;
  uint local_724;
  int local_720;
  int local_71c;
  undefined8 *local_718;
  undefined8 local_710;
  uint local_708;
  uint *local_700;
  undefined8 *local_6f8;
  undefined8 local_6f0;
  uint local_6e4;
  int local_6e0;
  int local_6dc;
  undefined8 *local_6d8;
  undefined8 local_6d0;
  uint local_6c8;
  v3i *local_6c0;
  undefined8 *local_6b8;
  undefined8 local_6b0;
  uint local_6a4;
  int local_6a0;
  int local_69c;
  undefined8 *local_698;
  v3i *local_690;
  undefined8 *local_688;
  extent *local_680;
  uint *local_678;
  undefined8 *local_670;
  undefined1 *local_668;
  v3<int> *local_660;
  extent *local_658;
  undefined8 *local_650;
  undefined1 *local_648;
  i64 local_640;
  char local_631;
  u64 local_630;
  char local_621;
  unsigned_long local_620;
  char local_611;
  undefined8 local_610;
  int local_608;
  undefined8 local_600;
  int local_5f8;
  extent *local_5f0;
  undefined8 local_5e8;
  int local_5e0;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_5d8;
  int local_5d0;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_5c8;
  int local_5c0;
  unsigned_long *local_5b8;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_5b0;
  int local_5a8;
  undefined8 *local_5a0;
  v3<int> *local_598;
  uint *local_590;
  undefined8 *local_588;
  v3i *local_580;
  undefined8 *local_578;
  array<idx2::subband> *local_570;
  long local_568;
  array<idx2::subband> *local_560;
  undefined8 local_558;
  int local_550;
  undefined8 local_548;
  int local_540;
  byte *local_538;
  undefined8 local_530;
  int local_528;
  undefined8 local_520;
  int local_518;
  undefined8 local_510;
  int local_508;
  byte *local_500;
  undefined8 local_4f8;
  int local_4f0;
  undefined8 local_4e8;
  int local_4e0;
  undefined8 local_4d8;
  int local_4d0;
  byte *local_4c8;
  undefined8 local_4c0;
  int local_4b8;
  undefined8 local_4b0;
  int local_4a8;
  undefined8 local_4a0;
  int local_498;
  byte *local_490;
  undefined8 local_488;
  int local_480;
  undefined8 local_478;
  int local_470;
  undefined8 local_468;
  int local_460;
  byte *local_458;
  undefined8 local_450;
  int local_448;
  undefined8 local_440;
  int local_438;
  undefined8 local_430;
  int local_428;
  byte *local_420;
  undefined8 local_418;
  int local_410;
  undefined8 local_408;
  int local_400;
  v3i *local_3f8;
  undefined1 *local_3f0;
  undefined8 local_3e8;
  int local_3dc;
  int local_3d8;
  int local_3d4;
  undefined8 *local_3d0;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_3c8;
  int local_3c0;
  v3i *local_3b8;
  undefined1 *local_3b0;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_3a8;
  int local_39c;
  int local_398;
  int local_394;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_390;
  i8 *local_388;
  undefined8 local_380;
  int local_378;
  v3i *local_370;
  undefined1 *local_368;
  undefined8 local_360;
  int local_354;
  int local_350;
  int local_34c;
  undefined8 *local_348;
  uint *local_340;
  u64 *local_338;
  uint *local_330;
  undefined8 local_328;
  int local_320;
  long local_318;
  undefined8 local_310;
  int local_304;
  int local_300;
  int local_2fc;
  undefined8 *local_2f8;
  undefined8 local_2f0;
  int local_2e8;
  long local_2e0;
  undefined8 local_2d8;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  undefined8 *local_2c0;
  undefined8 local_2b8;
  int local_2b0;
  long local_2a8;
  undefined8 local_2a0;
  int local_294;
  int local_290;
  int local_28c;
  undefined8 *local_288;
  undefined8 local_280;
  int local_278;
  long local_270;
  undefined8 local_268;
  int local_25c;
  int local_258;
  int local_254;
  undefined8 *local_250;
  undefined8 local_248;
  int local_240;
  long local_238;
  undefined8 local_230;
  int local_224;
  int local_220;
  int local_21c;
  undefined8 *local_218;
  undefined8 local_210;
  int local_208;
  long local_200;
  undefined8 local_1f8;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  undefined8 *local_1e0;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_1d8;
  int local_1d0;
  unsigned_long local_1c8;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_1c0;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_1a8;
  undefined8 local_1a0;
  int local_198;
  u64 local_190;
  undefined8 local_188;
  int local_17c;
  int local_178;
  int local_174;
  undefined8 *local_170;
  undefined8 local_168;
  int local_160;
  undefined8 local_158;
  int local_150;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_148;
  undefined8 local_140;
  int local_138;
  undefined8 local_130;
  int local_128;
  long local_120;
  undefined8 local_118;
  int local_10c;
  int local_108;
  int local_104;
  undefined8 *local_100;
  undefined8 local_f8;
  int local_f0;
  undefined8 local_e8;
  int local_e0;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_d8;
  undefined8 local_d0;
  int local_c8;
  undefined8 local_c0;
  int local_b8;
  long local_b0;
  undefined8 local_a8;
  int local_9c;
  int local_98;
  int local_94;
  undefined8 *local_90;
  undefined8 local_88;
  int local_80;
  undefined8 local_78;
  int local_70;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_68;
  undefined8 local_60;
  int local_58;
  undefined8 local_50;
  int local_48;
  anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0 local_40;
  undefined8 local_38;
  int local_2c;
  int local_28;
  int local_24;
  undefined8 *local_20;
  undefined4 *local_18;
  undefined8 *local_10;
  
  cVar5 = E->Level + IncrementLevel;
  E->Level = cVar5;
  if (0xf < cVar5) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,
                  "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]"
                 );
  }
  BIt.Idx = (E->Brick).Arr[(int)cVar5];
  BVol = (volume *)((unsigned_long *)(long)cVar5 + BIt.Idx * 2);
  local_620 = BIt.Idx;
  local_611 = cVar5;
  Lookup<unsigned_long,idx2::brick_volume>
            ((iterator *)local_8b0,(idx2 *)&E->BrickPool,
             (hash_table<unsigned_long,_idx2::brick_volume> *)&BVol,(unsigned_long *)(long)cVar5);
  local_8c0 = (volume *)BIt.Key;
  local_5b8 = BIt.Key + 5;
  local_1c8 = BIt.Key[6];
  local_1ac = ((int)local_1c8 << 0xb) >> 0xb;
  local_1a8 = &local_1c0;
  local_1b0 = (int)((long)(local_1c8 << 0x16) >> 0x2b);
  local_8cc.field_0.Z = (int)((long)(local_1c8 * 2) >> 0x2b);
  local_1c0.field_0.X = local_1ac;
  local_1c0.field_0.Y = local_1b0;
  local_1d8 = local_1c0;
  local_5c8 = local_1c0;
  local_5b0 = local_1c0;
  local_5d8 = local_1c0;
  local_8cc.field_3.XY.field_0 = (v2<int>)(v2<int>)local_1c0;
  local_5d0 = local_8cc.field_0.Z;
  local_5c0 = local_8cc.field_0.Z;
  local_5a8 = local_8cc.field_0.Z;
  local_1d0 = local_8cc.field_0.Z;
  local_1b4 = local_8cc.field_0.Z;
  ExtrapolateCdf53((v3i *)&local_8cc.field_0,Idx2->TransformOrder,(volume *)BIt.Key);
  ForwardCdf53(&Idx2->BrickDimsExt3,(int)E->Level,&Idx2->Subbands,&Idx2->TransformDetails,local_8c0,
               cVar5 + 1 == (int)Idx2->NLevels);
  S._6_1_ = '\0';
  do {
    local_570 = &Idx2->Subbands;
    if ((long)S._6_1_ == (Idx2->Subbands).Size) {
      Dealloc(local_8c0);
      local_640 = BIt.Idx;
      local_bf8._0_8_ = (unsigned_long *)(long)cVar5 + BIt.Idx * 2;
      local_631 = cVar5;
      Delete<unsigned_long,idx2::brick_volume>
                (&local_c18,(idx2 *)&E->BrickPool,
                 (hash_table<unsigned_long,_idx2::brick_volume> *)local_bf8,
                 (unsigned_long *)(long)cVar5);
      E->Level = E->Level - IncrementLevel;
      return;
    }
    local_560 = &Idx2->Subbands;
    local_568 = (long)S._6_1_;
    SbDimsNonExt3.field_0.field_4.YZ.field_0 =
         (v2<int>)((local_560->Buffer).Data + local_568 * 0x40);
    local_318 = *(long *)((long)SbDimsNonExt3.field_0.field_4.YZ.field_0 + 8);
    local_2fc = ((int)local_318 << 0xb) >> 0xb;
    local_2f8 = &local_310;
    local_300 = (int)((local_318 << 0x16) >> 0x2b);
    local_438 = (int)(local_318 * 2 >> 0x2b);
    local_310._0_4_ = local_2fc;
    local_310._4_4_ = local_300;
    local_328 = local_310;
    local_430 = local_310;
    local_418 = local_310;
    local_440 = local_310;
    local_908 = (int)local_310;
    local_2e0 = *(long *)((long)SbDimsNonExt3.field_0.field_4.YZ.field_0 + 8);
    local_2c4 = ((int)local_2e0 << 0xb) >> 0xb;
    local_2c0 = &local_2d8;
    local_2c8 = (int)((local_2e0 << 0x16) >> 0x2b);
    local_470 = (int)(local_2e0 * 2 >> 0x2b);
    local_2d8._0_4_ = local_2c4;
    local_2d8._4_4_ = local_2c8;
    local_2f0 = local_2d8;
    local_468 = local_2d8;
    local_450 = local_2d8;
    local_478 = local_2d8;
    local_928 = (int)local_2d8;
    local_8fc = local_908 - (uint)(1 < local_928);
    local_2a8 = *(long *)((long)SbDimsNonExt3.field_0.field_4.YZ.field_0 + 8);
    local_28c = ((int)local_2a8 << 0xb) >> 0xb;
    local_288 = &local_2a0;
    local_290 = (int)((local_2a8 << 0x16) >> 0x2b);
    local_4a8 = (int)(local_2a8 * 2 >> 0x2b);
    local_2a0._0_4_ = local_28c;
    local_2a0._4_4_ = local_290;
    local_2b8 = local_2a0;
    local_4a0 = local_2a0;
    local_488 = local_2a0;
    local_4b0 = local_2a0;
    iStack_944 = (int)((ulong)local_2a0 >> 0x20);
    local_270 = *(long *)((long)SbDimsNonExt3.field_0.field_4.YZ.field_0 + 8);
    local_254 = ((int)local_270 << 0xb) >> 0xb;
    local_250 = &local_268;
    local_258 = (int)((local_270 << 0x16) >> 0x2b);
    local_4e0 = (int)(local_270 * 2 >> 0x2b);
    local_268._0_4_ = local_254;
    local_268._4_4_ = local_258;
    local_280 = local_268;
    local_4d8 = local_268;
    local_4c0 = local_268;
    local_4e8 = local_268;
    iStack_964 = (int)((ulong)local_268 >> 0x20);
    local_8f8 = iStack_944 - (uint)(1 < iStack_964);
    local_238 = *(long *)((long)SbDimsNonExt3.field_0.field_4.YZ.field_0 + 8);
    local_21c = ((int)local_238 << 0xb) >> 0xb;
    local_218 = &local_230;
    local_220 = (int)((local_238 << 0x16) >> 0x2b);
    local_518 = (int)(local_238 * 2 >> 0x2b);
    local_230._0_4_ = local_21c;
    local_230._4_4_ = local_220;
    local_248 = local_230;
    local_510 = local_230;
    local_4f8 = local_230;
    local_520 = local_230;
    local_200 = *(long *)((long)SbDimsNonExt3.field_0.field_4.YZ.field_0 + 8);
    Brick3_00.field_0._8_4_ = ((int)local_200 << 0xb) >> 0xb;
    local_1e0 = &local_1f8;
    local_1e8 = (int)((local_200 << 0x16) >> 0x2b);
    local_550 = (int)(local_200 * 2 >> 0x2b);
    local_1f8._0_4_ = Brick3_00.field_0._8_4_;
    local_1f8._4_4_ = local_1e8;
    local_210 = local_1f8;
    local_548 = local_1f8;
    local_530 = local_1f8;
    local_558 = local_1f8;
    SbDimsNonExt3.field_0.field_0.X = local_518 - (uint)(1 < local_550);
    cVar6 = cVar5 + '\x01';
    local_540 = local_550;
    local_538 = (byte *)SbDimsNonExt3.field_0.field_4.YZ.field_0;
    local_528 = local_550;
    local_508 = local_518;
    local_500 = (byte *)SbDimsNonExt3.field_0.field_4.YZ.field_0;
    local_4f0 = local_518;
    local_4d0 = local_4e0;
    local_4c8 = (byte *)SbDimsNonExt3.field_0.field_4.YZ.field_0;
    local_4b8 = local_4e0;
    local_498 = local_4a8;
    local_490 = (byte *)SbDimsNonExt3.field_0.field_4.YZ.field_0;
    local_480 = local_4a8;
    local_460 = local_470;
    local_458 = (byte *)SbDimsNonExt3.field_0.field_4.YZ.field_0;
    local_448 = local_470;
    local_428 = local_438;
    local_420 = (byte *)SbDimsNonExt3.field_0.field_4.YZ.field_0;
    local_410 = local_438;
    local_320 = local_438;
    local_304 = local_438;
    local_2e8 = local_470;
    local_2cc = local_470;
    local_2b0 = local_4a8;
    local_294 = local_4a8;
    local_278 = local_4e0;
    local_25c = local_4e0;
    local_240 = local_518;
    local_224 = local_518;
    local_208 = local_550;
    local_1ec = local_550;
    local_1e4 = Brick3_00.field_0._8_4_;
    if ((S._6_1_ == '\0') && (cVar6 < Idx2->NLevels)) {
      iVar7 = (int)cVar5;
      if (0xf < iVar7) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                     );
      }
      iVar1 = (E->Bricks3).Arr[iVar7].field_0.field_0.Z;
      uVar2 = *(undefined8 *)&(E->Bricks3).Arr[iVar7].field_0;
      local_3b8 = &Idx2->GroupBrick3;
      local_3b0 = (undefined1 *)((long)&PBrick3.field_0 + 4);
      PBrick3.field_0.field_0.Y = (int)uVar2;
      PBrick3.field_0.field_0.Z = (int)((ulong)uVar2 >> 0x20);
      local_394 = PBrick3.field_0.field_0.Y / (local_3b8->field_0).field_0.X;
      local_398 = PBrick3.field_0.field_0.Z / (Idx2->GroupBrick3).field_0.field_0.Y;
      local_3c0 = iVar1 / (Idx2->GroupBrick3).field_0.field_0.Z;
      local_390 = &local_3a8;
      local_3a8.field_0.X = local_394;
      local_3a8.field_0.Y = local_398;
      local_3c8 = local_3a8;
      PBrick3.field_0._4_8_ = uVar2;
      local_39c = local_3c0;
      if (0xf < cVar6) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                     );
      }
      pvVar8 = (E->Bricks3).Arr + (int)cVar6;
      (pvVar8->field_0).field_3.XY.field_0 = local_3a8;
      (pvVar8->field_0).field_0.Z = local_3c0;
      PBrick3.field_0.field_0.X = (pvVar8->field_0).field_0.Z;
      Brick3_00.field_0.field_0.Y = 0;
      Brick3_00.field_0.field_0.X = PBrick3.field_0.field_0.X;
      uVar9 = GetLinearBrick((idx2 *)Idx2,(idx2_file *)(ulong)(uint)(int)cVar6,
                             (int)*(undefined8 *)&pvVar8->field_0,Brick3_00);
      if (0xf < cVar6) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]"
                     );
      }
      (E->Brick).Arr[(int)cVar6] = uVar9;
      PbIt.Idx = (i64)((unsigned_long *)(long)cVar6 + uVar9 * 2);
      local_630 = uVar9;
      local_621 = cVar6;
      Lookup<unsigned_long,idx2::brick_volume>
                ((iterator *)&PBrickVol.NChildrenDecoded,(idx2 *)&E->BrickPool,
                 (hash_table<unsigned_long,_idx2::brick_volume> *)&PbIt.Idx,
                 (unsigned_long *)(long)cVar6);
      local_388 = &PBrickVol.NChildrenDecoded;
      if (*(char *)((long)&(PbIt.Ht)->Keys +
                   (long)&(((PbIt.Val)->Vol).Buffer.Alloc)->_vptr_allocator) != '\x02') {
        this = (anon_union_8_4_6ba14846_for_v2<int>_1 *)
               ((long)&Iter.N.field_0.field_3.XY.field_0 + 4);
        brick_volume::brick_volume((brick_volume *)&this->field_0);
        Resize((volume *)&this->field_0,&Idx2->BrickDimsExt3,float64,E->Alloc);
        local_7d0 = this;
        volume_iterator<double>::volume_iterator
                  ((volume_iterator<double> *)((long)&Iter_1.N.field_0.field_3.XY.field_0 + 4));
        local_7c0 = &local_7dc;
        local_7c4 = 0;
        local_7dc._0_4_ = 0;
        local_7dc._4_4_ = 0;
        Iter.P.field_0.field_0.X = 0;
        Iter.Ptr = local_7dc;
        local_68 = local_7d0;
        local_40 = local_7d0[3].field_0;
        local_24 = (local_40.X << 0xb) >> 0xb;
        local_20 = &local_38;
        local_28 = (int)(((long)local_40 << 0x16) >> 0x2b);
        Iter.N.field_0.field_0.X = (int)((long)local_40 * 2 >> 0x2b);
        local_38._0_4_ = local_24;
        local_38._4_4_ = local_28;
        local_50 = local_38;
        local_78 = local_38;
        local_60 = local_38;
        local_88 = local_38;
        Iter.P.field_0.field_0.Y = (int)local_38;
        Iter.P.field_0.field_0.Z = (int)((ulong)local_38 >> 0x20);
        Iter_1.N.field_0._4_8_ = *local_7d0;
        To3.field_0._4_8_ = this;
        local_80 = Iter.N.field_0.field_0.X;
        local_70 = Iter.N.field_0.field_0.X;
        local_58 = Iter.N.field_0.field_0.X;
        local_48 = Iter.N.field_0.field_0.X;
        local_2c = Iter.N.field_0.field_0.X;
        volume_iterator<double>::volume_iterator((volume_iterator<double> *)auStack_ac0);
        local_d8 = (anon_union_8_4_6ba14846_for_v2<int>_1)To3.field_0.field_4.YZ.field_0;
        local_b0 = *(long *)((long)To3.field_0.field_4.YZ.field_0 + 0x18);
        local_94 = ((int)local_b0 << 0xb) >> 0xb;
        local_90 = &local_a8;
        local_98 = (int)((local_b0 << 0x16) >> 0x2b);
        local_790 = (int)(local_b0 * 2 >> 0x2b);
        local_a8._0_4_ = local_94;
        local_a8._4_4_ = local_98;
        local_c0 = local_a8;
        local_e8 = local_a8;
        local_d0 = local_a8;
        local_f8 = local_a8;
        local_798 = local_a8;
        local_788 = local_a8;
        local_18 = &local_77c;
        local_77c = 0;
        local_778 = 0;
        local_148 = (anon_union_8_4_6ba14846_for_v2<int>_1)To3.field_0.field_4.YZ.field_0;
        local_120 = *(long *)((long)To3.field_0.field_4.YZ.field_0 + 0x18);
        local_104 = ((int)local_120 << 0xb) >> 0xb;
        local_100 = &local_118;
        local_108 = (int)((local_120 << 0x16) >> 0x2b);
        local_7b0 = (int)(local_120 * 2 >> 0x2b);
        local_118._0_4_ = local_104;
        local_118._4_4_ = local_108;
        local_130 = local_118;
        local_158 = local_118;
        local_140 = local_118;
        local_168 = local_118;
        local_7b8 = local_118;
        local_7a8 = local_118;
        uVar2 = local_7a8;
        local_10 = &local_7a8;
        local_7a8._0_4_ = (int)local_118;
        local_7a8._4_4_ = (int)((ulong)local_118 >> 0x20);
        auStack_ac0 = (undefined1  [8])
                      (*(long *)To3.field_0.field_4.YZ.field_0 +
                      (long)local_790 * (long)(int)local_7a8 * (long)local_7a8._4_4_ * 8);
        From3.field_0.field_4.YZ.field_0 = (v2<int>)(anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
        Beg.N.field_0.field_0.X = Iter.P.field_0.field_0.Y;
        Beg.P.field_0.field_0.Z = Iter.P.field_0.field_0.X;
        Beg.N.field_0.field_0.Z = Iter.N.field_0.field_0.X;
        Beg.N.field_0.field_0.Y = Iter.P.field_0.field_0.Z;
        Beg.P.field_0.field_3.XY.field_0 = (v2<int>)(v2<int>)Iter.Ptr;
        Beg.Ptr = (double *)Iter_1.N.field_0.field_4.YZ.field_0;
        End.P.field_0.field_3.XY.field_0 = (v2<int>)(v2<int>)Iter_1.Ptr;
        End.Ptr = (double *)auStack_ac0;
        End._16_8_ = Iter_1.P.field_0.field_3.XY.field_0;
        End.N.field_0.field_4.YZ.field_0 = (v2<int>)(v2<int>)Iter_1._16_8_;
        local_7a8 = uVar2;
        local_7a0 = local_7b0;
        local_780 = local_790;
        local_160 = local_7b0;
        local_150 = local_7b0;
        local_138 = local_7b0;
        local_128 = local_7b0;
        local_10c = local_7b0;
        local_f0 = local_790;
        local_e0 = local_790;
        local_c8 = local_790;
        local_b8 = local_790;
        local_9c = local_790;
        To3.field_0.field_0.X = local_790;
        Fill<idx2::volume_iterator<double>,double>
                  (Beg,End,(double *)((long)&From3.field_0.field_3.XY.field_0 + 4));
        local_3f8 = &Idx2->GroupBrick3;
        local_3f0 = (undefined1 *)((long)&PBrick3.field_0 + 4);
        local_3d4 = PBrick3.field_0.field_0.Y / (local_3f8->field_0).field_0.X;
        local_3d8 = PBrick3.field_0.field_0.Z / (Idx2->GroupBrick3).field_0.field_0.Y;
        local_ad8 = iVar1 / (Idx2->GroupBrick3).field_0.field_0.Z;
        local_3d0 = &local_3e8;
        local_3e8._0_4_ = local_3d4;
        local_3e8._4_4_ = local_3d8;
        local_408 = local_3e8;
        local_ae0 = local_3e8;
        uVar2 = local_ae0;
        local_6c0 = &Idx2->GroupBrick3;
        local_6b8 = &local_ae0;
        local_ae0._0_4_ = (int)local_3e8;
        local_ae0._4_4_ = (int)((ulong)local_3e8 >> 0x20);
        local_69c = (int)local_ae0 * (local_6c0->field_0).field_0.X;
        local_6a0 = local_ae0._4_4_ * (Idx2->GroupBrick3).field_0.field_0.Y;
        From3.field_0.field_0.X = local_ad8 * (Idx2->GroupBrick3).field_0.field_0.Z;
        local_698 = &local_6b0;
        local_6b0._0_4_ = local_69c;
        local_6b0._4_4_ = local_6a0;
        local_6d0 = local_6b0;
        stack0xfffffffffffff500 = local_6b0;
        local_ad4 = local_6b0;
        uVar4 = local_ad4;
        local_690 = &Idx2->GroupBrick3;
        local_680 = &local_b30;
        local_688 = &local_ad4;
        local_ad4._0_4_ = (uint)local_6b0;
        local_ad4._4_4_ = (uint)((ulong)local_6b0 >> 0x20);
        local_b30.From =
             (long)(int)((uint)local_ad4 & 0x1fffff) +
             (long)(int)(local_ad4._4_4_ & 0x1fffff) * 0x200000 +
             ((long)(int)(From3.field_0.field_0.X & 0x1fffff) << 0x2a);
        local_b30.Dims =
             (long)(int)((local_690->field_0).field_0.X & 0x1fffff) +
             (long)(int)((Idx2->GroupBrick3).field_0.field_0.Y & 0x1fffff) * 0x200000 +
             ((long)(int)((Idx2->GroupBrick3).field_0.field_0.Z & 0x1fffff) << 0x2a);
        local_ae0 = uVar2;
        local_ad4 = uVar4;
        local_6c8 = From3.field_0.field_0.X;
        local_6a4 = From3.field_0.field_0.X;
        local_580 = local_690;
        local_578 = local_688;
        local_400 = local_ad8;
        local_3dc = local_ad8;
        if (0xf < cVar5) {
          __assert_fail("Idx < N",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                        ,0x20c,
                        "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                       );
        }
        local_660 = (Idx2->NBricks3).Arr + (int)cVar5;
        local_658 = &local_b40;
        local_b40.From = 0;
        local_b40.Dims =
             (ulong)((local_660->field_0).field_0.X & 0x1fffff) |
             (ulong)((local_660->field_0).field_0.Y & 0x1fffff) << 0x15 |
             (ulong)((local_660->field_0).field_0.Z & 0x1fffff) << 0x2a;
        local_598 = local_660;
        local_b20 = Crop<idx2::extent,idx2::extent>(&local_b30,local_658);
        local_5f0 = &local_b20;
        local_190 = local_b20.Dims;
        local_174 = ((int)local_b20.Dims << 0xb) >> 0xb;
        local_170 = &local_188;
        local_178 = (int)((long)(local_b20.Dims << 0x16) >> 0x2b);
        local_b48 = (int)((long)(local_b20.Dims * 2) >> 0x2b);
        local_188._0_4_ = local_174;
        local_188._4_4_ = local_178;
        local_1a0 = local_188;
        local_600 = local_188;
        local_5e8 = local_188;
        local_610 = local_188;
        local_b50 = local_188;
        local_b10 = local_188;
        uVar4 = local_b10;
        local_6f8 = &local_b10;
        local_b10._0_4_ = (int)local_188;
        local_b10._4_4_ = (int)((ulong)local_188 >> 0x20);
        PBrickVol.ExtentLocal.Dims._1_1_ =
             (char)local_188 * (char)((ulong)local_188 >> 0x20) * (char)local_b48;
        local_700 = &local_8fc;
        local_6dc = (int)local_b10 * local_8fc;
        local_6e0 = local_b10._4_4_ * local_8f8;
        local_708 = local_b48 * SbDimsNonExt3.field_0.field_0.X;
        local_6d8 = &local_6f0;
        local_6f0._0_4_ = local_6dc;
        local_6f0._4_4_ = local_6e0;
        local_710 = local_6f0;
        local_b6c = local_6f0;
        uVar2 = local_b6c;
        local_648 = local_b60;
        local_650 = &local_b6c;
        local_b6c._0_4_ = (uint)local_6f0;
        local_b6c._4_4_ = (uint)((ulong)local_6f0 >> 0x20);
        PBrickVol.ExtentLocal.From =
             (long)(int)((uint)local_b6c & 0x1fffff) +
             (long)(int)(local_b6c._4_4_ & 0x1fffff) * 0x200000 +
             ((long)(int)(local_b64 & 0x1fffff) << 0x2a);
        PBrickVol.Vol.Type = int8;
        PBrickVol.Vol._33_7_ = 0;
        local_b6c = uVar2;
        local_b64 = local_708;
        local_b10 = uVar4;
        NChildren3.field_0.field_0.X = local_b48;
        local_6e4 = local_708;
        local_608 = local_b48;
        local_5f8 = local_b48;
        local_5e0 = local_b48;
        local_5a0 = local_650;
        local_198 = local_b48;
        local_17c = local_b48;
        Insert<unsigned_long,idx2::brick_volume>
                  ((iterator *)&PBrickVol.NChildrenDecoded,(unsigned_long *)&PbIt.Idx,
                   (brick_volume *)((long)&Iter.N.field_0.field_3.XY.field_0 + 4));
      }
      local_370 = &Idx2->GroupBrick3;
      local_368 = (undefined1 *)((long)&PBrick3.field_0 + 4);
      local_34c = PBrick3.field_0.field_0.Y % (local_370->field_0).field_0.X;
      local_350 = PBrick3.field_0.field_0.Z % (Idx2->GroupBrick3).field_0.field_0.Y;
      local_378 = iVar1 % (Idx2->GroupBrick3).field_0.field_0.Z;
      local_348 = &local_360;
      local_360._0_4_ = local_34c;
      local_360._4_4_ = local_350;
      local_380 = local_360;
      ToGrid.Dims = *(u64 *)SbDimsNonExt3.field_0.field_4.YZ.field_0;
      local_338 = &ToGrid.Dims;
      local_340 = &local_8fc;
      local_b90 = (int)local_360;
      iStack_b8c = (int)((ulong)local_360 >> 0x20);
      local_71c = local_b90 * local_8fc;
      local_720 = iStack_b8c * local_8f8;
      local_be0 = local_378 * SbDimsNonExt3.field_0.field_0.X;
      local_718 = &local_730;
      local_730._0_4_ = local_71c;
      local_730._4_4_ = local_720;
      stack0xfffffffffffff418 = local_730;
      local_bd4 = local_730;
      pbVar3 = local_bd4;
      local_668 = local_bc8;
      local_670 = &local_bd4;
      local_678 = &local_8fc;
      local_bd4._0_4_ = (uint)local_730;
      local_bd4._4_4_ = (uint)((ulong)local_730 >> 0x20);
      local_bc8 = (undefined1  [8])
                  ((long)(int)((uint)local_bd4 & 0x1fffff) +
                   (long)(int)(local_bd4._4_4_ & 0x1fffff) * 0x200000 +
                  ((long)(int)(local_be0 & 0x1fffff) << 0x2a));
      ToGrid.From = (long)(int)(local_8fc & 0x1fffff) + (long)(int)(local_8f8 & 0x1fffff) * 0x200000
                    + ((long)(int)(SbDimsNonExt3.field_0.field_0.X & 0x1fffff) << 0x2a);
      local_bd4 = pbVar3;
      local_bcc = local_be0;
      local_724 = local_be0;
      local_590 = local_678;
      local_588 = local_670;
      local_354 = local_378;
      local_330 = local_340;
      CopyGridExtent<double,double>
                ((grid *)&ToGrid.Dims,local_8c0,(extent *)local_bc8,(volume *)PbIt.Key);
      cVar6 = (char)PbIt.Key[7] + '\x01';
      *(char *)(PbIt.Key + 7) = cVar6;
      local_bf8[0xf] = cVar6 == *(char *)((long)PbIt.Key + 0x39);
      if ((bool)local_bf8[0xf]) {
        EncodeBrick(Idx2,P,E,true);
      }
    }
    E->Subband = S._6_1_;
    EncodeSubband(Idx2,E,(grid *)SbDimsNonExt3.field_0.field_4.YZ.field_0,local_8c0);
    S._6_1_ = S._6_1_ + '\x01';
  } while( true );
}

Assistant:

static void
EncodeBrick(idx2_file* Idx2, const params& P, encode_data* E, bool IncrementLevel = false)
{
  idx2_Assert(Idx2->NLevels <= idx2_file::MaxLevels);

  i8 Level = E->Level += IncrementLevel;

  u64 Brick = E->Brick[Level];
  //printf(
  //  "level %d brick " idx2_PrStrV3i " %" PRIu64 "\n", Iter, idx2_PrV3i(E->Bricks3[Iter]), Brick);
  auto BIt = Lookup(E->BrickPool, GetBrickKey(Level, Brick));
  idx2_Assert(BIt);
  volume& BVol = BIt.Val->Vol;
  idx2_Assert(BVol.Buffer);

  // TODO: we do not need to pre-extrapolate, instead just compute and store the extrapolated values
  ExtrapolateCdf53(Dims(BIt.Val->ExtentLocal), Idx2->TransformOrder, &BVol);

  /* do wavelet transform */
  bool CoarsestLevel = Level + 1 == Idx2->NLevels; // only normalize
  ForwardCdf53(Idx2->BrickDimsExt3, E->Level, Idx2->Subbands, Idx2->TransformDetails, &BVol, CoarsestLevel);

  /* recursively encode the brick, one subband at a time */
  idx2_For (i8, Sb, 0, Size(Idx2->Subbands))
  { // subband loop
    const subband& S = Idx2->Subbands[Sb];
    v3i SbDimsNonExt3 = idx2_NonExtDims(Dims(S.Grid));
    i8 NextLevel = Level + 1;
    if (Sb == 0 && NextLevel < Idx2->NLevels)
    { // need to encode the parent brick
      /* find the parent brick and create it if not found */
      v3i Brick3 = E->Bricks3[Level];
      v3i PBrick3 = (E->Bricks3[NextLevel] = Brick3 / Idx2->GroupBrick3);
      u64 PBrick = (E->Brick[NextLevel] = GetLinearBrick(*Idx2, NextLevel, PBrick3));
      u64 PKey = GetBrickKey(NextLevel, PBrick);
      auto PbIt = Lookup(E->BrickPool, PKey);
      if (!PbIt)
      { // instantiate the parent brick in the hash table
        brick_volume PBrickVol;
        Resize(&PBrickVol.Vol, Idx2->BrickDimsExt3, dtype::float64, E->Alloc);
        Fill(idx2_Range(f64, PBrickVol.Vol), 0.0);
        v3i From3 = (Brick3 / Idx2->GroupBrick3) * Idx2->GroupBrick3;
        v3i NChildren3 =
          Dims(Crop(extent(From3, Idx2->GroupBrick3), extent(Idx2->NBricks3[Level])));
        PBrickVol.NChildrenMax = (i8)Prod(NChildren3);
        PBrickVol.ExtentLocal = extent(NChildren3 * SbDimsNonExt3);
        Insert(&PbIt, PKey, PBrickVol);
      }
      /* copy data to the parent brick and (optionally) encode it */
      v3i LocalBrickPos3 = Brick3 % Idx2->GroupBrick3;
      grid SbGridNonExt = S.Grid;
      SetDims(&SbGridNonExt, SbDimsNonExt3);
      extent ToGrid(LocalBrickPos3 * SbDimsNonExt3, SbDimsNonExt3);
      CopyGridExtent<f64, f64>(SbGridNonExt, BVol, ToGrid, &PbIt.Val->Vol);
      //      Copy(SbGridNonExt, BVol, ToGrid, &PbIt.Val->Vol);
      bool LastChild = ++PbIt.Val->NChildrenDecoded == PbIt.Val->NChildrenMax;
      if (LastChild)
        EncodeBrick(Idx2, P, E, true);
    } // end Sb == 0 && NextIteration < Idx2->NLevels
    E->Subband = Sb;
    EncodeSubband(Idx2, E, S.Grid, &BVol);
  } // end subband loop
  Dealloc(&BVol);
  Delete(&E->BrickPool, GetBrickKey(Level, Brick));
  E->Level -= IncrementLevel;
}